

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFunctionalTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderLibraryGroup::init(ShaderLibraryGroup *this,EVP_PKEY_CTX *ctx)

{
  File *pFVar1;
  int in_EAX;
  ShaderLibraryTest *this_00;
  long lVar2;
  long lVar3;
  
  if (0 < this->m_numFiles) {
    lVar3 = 0x10;
    lVar2 = 0;
    do {
      this_00 = (ShaderLibraryTest *)operator_new(0x98);
      pFVar1 = this->m_files;
      ShaderLibraryTest::ShaderLibraryTest
                (this_00,(this->super_TestCaseGroup).m_context,
                 *(char **)((long)pFVar1 + lVar3 + -0x10),*(char **)((long)pFVar1 + lVar3 + -8),
                 *(char **)((long)&pFVar1->fileName + lVar3));
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      lVar2 = lVar2 + 1;
      in_EAX = this->m_numFiles;
      lVar3 = lVar3 + 0x18;
    } while (lVar2 < in_EAX);
  }
  return in_EAX;
}

Assistant:

void init (void)
	{
		for (int ndx = 0; ndx < m_numFiles; ++ndx)
			addChild(new ShaderLibraryTest(m_context, m_files[ndx].fileName, m_files[ndx].testName, m_files[ndx].description));
	}